

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_16U,_4U>::Init(WavingSketch<8U,_16U,_4U> *this,Data<4U> *item,uint time)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  uint position;
  uint i;
  bool init;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar4;
  
  if (*(uint *)(in_RDI + 0x12) < in_EDX) {
    *(uint *)(in_RDI + 0x12) = in_EDX;
    BitSet::Clear((BitSet *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  bVar1 = true;
  for (uVar4 = 0; uVar4 < *(uint *)((long)in_RDI + 0x7c); uVar4 = uVar4 + 1) {
    uVar3 = Data<4U>::Hash((Data<4U> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
                           (uint)((ulong)in_RDI >> 0x20));
    in_stack_ffffffffffffffe0 = uVar3 % *(uint *)(in_RDI + 0x10);
    bVar2 = BitSet::Get((BitSet *)in_RDI[0x11],in_stack_ffffffffffffffe0);
    if (!bVar2) {
      bVar1 = false;
      BitSet::Set((BitSet *)in_RDI[0x11],in_stack_ffffffffffffffe0);
    }
  }
  if (!bVar1) {
    (**(code **)*in_RDI)(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item, uint time) {
		if (time > record) {
			record = time;
			bitset->Clear();
		}

		bool init = true;
		for (uint i = 0; i < HASH_NUM; ++i) {
			uint position = item.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		if (!init) Init(item);
	}